

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSubmitCommand.cxx
# Opt level: O0

unique_ptr<cmCommand,_std::default_delete<cmCommand>_> __thiscall
cmCTestSubmitCommand::Clone(cmCTestSubmitCommand *this)

{
  cmCTest *pcVar1;
  cmCTestScriptHandler *pcVar2;
  pointer pcVar3;
  long in_RSI;
  unique_ptr<cmCTestSubmitCommand,_std::default_delete<cmCTestSubmitCommand>_> local_20;
  __single_object ni;
  cmCTestSubmitCommand *this_local;
  
  std::make_unique<cmCTestSubmitCommand>();
  pcVar1 = *(cmCTest **)(in_RSI + 0x18);
  pcVar3 = std::unique_ptr<cmCTestSubmitCommand,_std::default_delete<cmCTestSubmitCommand>_>::
           operator->(&local_20);
  (pcVar3->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest = pcVar1;
  pcVar2 = *(cmCTestScriptHandler **)(in_RSI + 0x20);
  pcVar3 = std::unique_ptr<cmCTestSubmitCommand,_std::default_delete<cmCTestSubmitCommand>_>::
           operator->(&local_20);
  (pcVar3->super_cmCTestHandlerCommand).super_cmCTestCommand.CTestScriptHandler = pcVar2;
  std::unique_ptr<cmCommand,std::default_delete<cmCommand>>::
  unique_ptr<cmCTestSubmitCommand,std::default_delete<cmCTestSubmitCommand>,void>
            ((unique_ptr<cmCommand,std::default_delete<cmCommand>> *)this,&local_20);
  std::unique_ptr<cmCTestSubmitCommand,_std::default_delete<cmCTestSubmitCommand>_>::~unique_ptr
            (&local_20);
  return (__uniq_ptr_data<cmCommand,_std::default_delete<cmCommand>,_true,_true>)
         (__uniq_ptr_data<cmCommand,_std::default_delete<cmCommand>,_true,_true>)this;
}

Assistant:

std::unique_ptr<cmCommand> cmCTestSubmitCommand::Clone()
{
  auto ni = cm::make_unique<cmCTestSubmitCommand>();
  ni->CTest = this->CTest;
  ni->CTestScriptHandler = this->CTestScriptHandler;
  return std::unique_ptr<cmCommand>(std::move(ni));
}